

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

LockNode * __thiscall GraphBuilder::addNode<LockNode>(GraphBuilder *this,LockNode *node)

{
  bool bVar1;
  __ireturn_type _Var2;
  LockNode *local_28;
  LockNode *local_20;
  
  local_28 = node;
  local_20 = (LockNode *)Node::callInstruction(&node->super_Node);
  std::
  _Hashtable<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,LockNode*>,std::allocator<std::pair<llvm::CallInst_const*const,LockNode*>>,std::__detail::_Select1st,std::equal_to<llvm::CallInst_const*>,std::hash<llvm::CallInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<llvm::CallInst_const*,LockNode*&>
            ((_Hashtable<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,LockNode*>,std::allocator<std::pair<llvm::CallInst_const*const,LockNode*>>,std::__detail::_Select1st,std::equal_to<llvm::CallInst_const*>,std::hash<llvm::CallInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->llvmToLocks_,&local_20,&local_28);
  bVar1 = Node::isArtificial(&local_28->super_Node);
  if (bVar1) {
    local_20 = local_28;
    _Var2 = std::__detail::
            _Insert<Node_*,_Node_*,_std::allocator<Node_*>,_std::__detail::_Identity,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<Node_*,_Node_*,_std::allocator<Node_*>,_std::__detail::_Identity,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&this->artificialNodes_,(value_type *)&local_20);
  }
  else {
    local_20 = (LockNode *)Node::llvmInstruction(&local_28->super_Node);
    _Var2 = (__ireturn_type)
            std::
            _Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<llvm::Instruction_const*,LockNode*&>
                      ((_Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->llvmToNodeMap_,&local_20,&local_28);
  }
  if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_28 = (LockNode *)0x0;
  }
  return local_28;
}

Assistant:

LockNode *GraphBuilder::addNode(LockNode *node) {
    llvmToLocks_.emplace(node->callInstruction(), node);
    if (node->isArtificial()) {
        if (this->artificialNodes_.insert(node).second) {
            return node;
        }
    } else {
        if (this->llvmToNodeMap_.emplace(node->llvmInstruction(), node)
                    .second) {
            return node;
        }
    }

    return nullptr;
}